

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Node.hpp
# Opt level: O0

void __thiscall CAMFImporter_NodeElement::~CAMFImporter_NodeElement(CAMFImporter_NodeElement *this)

{
  CAMFImporter_NodeElement *this_local;
  
  ~CAMFImporter_NodeElement(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~CAMFImporter_NodeElement() {
        // empty
    }